

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

FFont * FFont::FindFont(char *name)

{
  int iVar1;
  FFont *pFVar2;
  
  if (name == (char *)0x0) {
    pFVar2 = (FFont *)0x0;
  }
  else {
    pFVar2 = FirstFont;
    if (FirstFont != (FFont *)0x0) {
      do {
        iVar1 = strcasecmp(pFVar2->Name,name);
        if (iVar1 == 0) {
          return pFVar2;
        }
        pFVar2 = pFVar2->Next;
      } while (pFVar2 != (FFont *)0x0);
    }
  }
  return pFVar2;
}

Assistant:

FFont *FFont::FindFont (const char *name)
{
	if (name == NULL)
	{
		return NULL;
	}
	FFont *font = FirstFont;

	while (font != NULL)
	{
		if (stricmp (font->Name, name) == 0)
			break;
		font = font->Next;
	}
	return font;
}